

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::io::ZeroCopyInputStream*>
          (MessageLite *this,ZeroCopyInputStream **input)

{
  bool bVar1;
  long *in_RDI;
  bool res;
  bool alias;
  MessageLite *in_stack_00000058;
  ZeroCopyInputStream *in_stack_00000060;
  MessageLite *in_stack_ffffffffffffffd8;
  undefined1 local_13;
  
  (**(code **)(*in_RDI + 0x38))();
  bVar1 = internal::MergePartialFromImpl<false>(in_stack_00000060,in_stack_00000058);
  local_13 = false;
  if (bVar1) {
    local_13 = IsInitializedWithErrors(in_stack_ffffffffffffffd8);
  }
  return local_13;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}